

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bf.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ulong uVar1;
  int *piVar2;
  char cVar3;
  uint uVar4;
  ostream *poVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  bool bVar14;
  char c;
  int local_a4;
  vector<int,_std::allocator<int>_> mem;
  vector<char,_std::allocator<char>_> code;
  int local_60;
  duration<long,_std::ratio<1L,_1000L>_> local_58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> matching;
  
  uVar7 = 0;
  std::ios_base::sync_with_stdio(false);
  if (1 < argc) {
    std::__cxx11::string::string((string *)&code,argv[1],(allocator *)&mem);
    uVar4 = std::__cxx11::stoi((string *)&code,(size_t *)0x0,10);
    uVar7 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar7 = 0;
    }
    std::__cxx11::string::~string((string *)&code);
  }
  code.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  code.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  code.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<char,_std::allocator<char>_>::reserve(&code,0x400);
  while( true ) {
    while( true ) {
      uVar4 = getchar();
      mem.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
      _0_1_ = (char)uVar4;
      if ((char)mem.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start != '~') break;
      if (code.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish !=
          code.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        code.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = code.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish + -1;
      }
    }
    if ((uVar4 & 0xff) == 0xff) break;
    std::vector<char,_std::allocator<char>_>::push_back(&code,(value_type *)&mem);
  }
  uVar8 = (long)code.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
                ._M_finish -
          (long)code.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
                ._M_start;
  std::vector<int,_std::allocator<int>_>::vector(&mem,10000,(allocator_type *)&matching);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&matching,uVar8 & 0xffffffff,(allocator_type *)&local_58);
  uVar6 = uVar8 & 0xffffffff;
  uVar9 = 0;
  do {
    if (uVar9 == uVar6) {
      local_60 = 0;
      bVar14 = false;
LAB_001024bf:
      if (!bVar14) {
        iVar10 = 0;
        uVar4 = 0;
        local_a4 = 0;
        while (uVar4 < (uint)uVar8) {
          local_58.__r = uVar7;
          std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_58);
          poVar5 = std::operator<<((ostream *)&std::cout,
                                   code.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                   super__Vector_impl_data._M_start[(int)uVar4]);
          poVar5 = std::operator<<(poVar5," ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar4);
          poVar5 = std::operator<<(poVar5," ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar10);
          poVar5 = std::operator<<(poVar5," ");
          lVar13 = (long)iVar10;
          poVar5 = (ostream *)
                   std::ostream::operator<<
                             (poVar5,*(int *)(CONCAT71(mem.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  (char)mem.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start) +
                                             lVar13 * 4));
          std::operator<<(poVar5," ");
          uVar12 = uVar4 + 1;
          cVar3 = code.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start[(int)uVar4];
          switch(cVar3) {
          case '+':
            piVar2 = (int *)(CONCAT71(mem.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start._1_7_,
                                      (char)mem.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_start) + lVar13 * 4);
            *piVar2 = *piVar2 + 1;
            break;
          case ',':
            std::operator>>((istream *)&std::cin,&c);
            *(int *)(CONCAT71(mem.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._1_7_,
                              (char)mem.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start) + lVar13 * 4) = (int)c;
            break;
          case '-':
            piVar2 = (int *)(CONCAT71(mem.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start._1_7_,
                                      (char)mem.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_start) + lVar13 * 4);
            *piVar2 = *piVar2 + -1;
            break;
          case '.':
            cVar3 = (char)*(undefined4 *)
                           (CONCAT71(mem.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._1_7_,
                                     (char)mem.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                           .super__Vector_impl_data._M_start) + lVar13 * 4);
            if (cVar3 < '\0') {
              cVar3 = '*';
            }
            std::operator<<((ostream *)&std::cerr,cVar3);
            std::ostream::flush();
            std::operator<<((ostream *)&std::cout,cVar3);
            break;
          default:
            if (cVar3 == '<') {
              bVar14 = iVar10 < 1;
              iVar10 = iVar10 + -1;
              if (bVar14) {
                iVar10 = 9999;
              }
            }
            else if (cVar3 == '>') {
              bVar14 = 0x270e < iVar10;
              iVar10 = iVar10 + 1;
              if (bVar14) {
                iVar10 = 0;
              }
            }
            else if (cVar3 == '[') {
              if (*(int *)(CONCAT71(mem.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start._1_7_,
                                    (char)mem.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start) + lVar13 * 4) == 0) {
                uVar12 = matching.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start[(int)uVar4];
                std::operator<<((ostream *)&std::cout,"- ");
                uVar12 = uVar12 + 1;
              }
              else {
                std::operator<<((ostream *)&std::cout,"+ ");
                local_a4 = local_a4 + 1;
              }
              std::ostream::operator<<((ostream *)&std::cout,local_a4);
            }
            else if (cVar3 == ']') {
              uVar12 = matching.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start[(int)uVar4];
              poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar12);
              std::operator<<(poVar5," ");
              local_a4 = local_a4 + -1;
              std::ostream::operator<<((ostream *)&std::cout,local_a4);
            }
          }
          uVar4 = uVar12;
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        }
      }
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&matching.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&mem.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                (&code.super__Vector_base<char,_std::allocator<char>_>);
      return local_60;
    }
    if (code.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar9] != ']') {
      if (code.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar9] == '[') {
        iVar10 = 1;
        uVar11 = uVar9;
        while ((uVar1 = uVar11 + 1, uVar1 < uVar6 && (iVar10 != 0))) {
          lVar13 = uVar11 + 1;
          uVar11 = uVar1;
          if (code.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar13] == ']') {
            iVar10 = iVar10 + -1;
          }
          else if (code.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar13] == '[') {
            iVar10 = iVar10 + 1;
          }
        }
        if (iVar10 != 0) {
          bVar14 = uVar9 < uVar6;
          std::operator<<((ostream *)&std::cerr,"Mismatching parens.");
          local_60 = 1;
          goto LAB_001024bf;
        }
        matching.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar9] = (uint)uVar11;
        matching.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar11 & 0xffffffff] = (uint)uVar9;
      }
      else {
        matching.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar9] = (uint)uVar8;
      }
    }
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

int main(int argc, char** argv) {
  cout.sync_with_stdio(false);

  int delay_ms = 0;
  if (argc > 1) {
    char* dn = argv[1];
    string st(dn);
    try {
      delay_ms = stoi(st);
    } catch (std::invalid_argument) {
      cerr << "Invalid duration." << endl;
      return 1;
    }
    if (delay_ms < 0) delay_ms = 0;
  }

  vector<char> code;
  {
    code.reserve(1024);
    char ch;
    while ((ch = getchar()) != END) {
      if (ch == BACK) {
        if (code.size()) code.pop_back();
      } else
        code.push_back(ch);
    }
  }
  const unsigned int m = code.size();

  vector<int> mem(N);
  int iMem = 0;

  vector<unsigned int> matching(m);
  for (unsigned int i = 0; i < m; i++) {
    switch (code[i]) {
      case '[':
        {
          unsigned int level = 1;
          unsigned int j = i + 1;
          for (; j < m && level > 0; j++) {
            switch (code[j]) {
              case '[': level++; break;
              case ']': level--; break;
              default: break;
            }
          }

          if (level > 0) {
            cerr << "Mismatching parens.";
            return 1;
          }

          j--;

          //cout << i << "::" << j << "- " << endl;
          matching[i] = j;
          matching[j] = i;
        }
        break;
      case ']':
        break;
      default:
        matching[i] = m;
        break;
    }
  }

#if 0
  for (int i = 0; i < m; i++) {
    cout << "[" << i << "] = " << code[i] << " ";
    if (matching[i] == m)
      cout << endl;
    else
      cout << matching[i] << endl;
  }
#endif

  int pc = 0;
  int level = 0;
  while (pc < m) {
    std::this_thread::sleep_for(std::chrono::milliseconds(delay_ms));
    int pc1 = pc + 1;
    cout << code[pc] << " " << pc << " " << iMem << " " << mem[iMem] << " ";
    switch (code[pc]) {
      case '+':
        mem[iMem]++;
        break;
      case '-':
        mem[iMem]--;
        break;
      case '<':
        iMem--;
        if (iMem < 0) iMem = N-1;
        break;
      case '>':
        iMem++;
        if (iMem >= N) iMem = 0;
        break;
      case '[':
        if (mem[iMem] == 0) {
          pc1 = matching[pc] + 1;
          cout << "- ";
        } else {
          cout << "+ ";
          level++;
        }
        cout << level;
        break;
      case ']':
        pc1 = matching[pc];
        cout << pc1 << " ";
        level--;
        cout << level;
        break;
      case '.':
        {
          char cho = !(((char)mem[iMem]) & (char)0x80) ? (char)mem[iMem] : '*';
          cerr << cho;
          cerr.flush();
          cout << cho;
        }
        break;
      case ',':
        char c; cin >> c;
        mem[iMem] = c;
        break;
      default: break;
    }
    cout << endl;
    pc = pc1;
  }
}